

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  float *pfVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  value_type *ppIVar5;
  ImFont *font;
  ImGuiWindow *pIVar6;
  value_type *ppIVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_a0;
  float local_9c;
  float local_98;
  ImVec2 local_88;
  value_type local_80;
  ImGuiWindow *window_1;
  int i_1;
  float scroll_amount_1;
  float scroll_amount;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 offset;
  float scale;
  float new_font_scale;
  bool scroll_allowed;
  ImGuiWindow *scroll_window;
  ImGuiWindow *window;
  int local_28;
  float fStack_24;
  int i;
  float local_1c;
  float fStack_18;
  int local_14;
  ImGuiContext *pIStack_10;
  int n;
  ImGuiContext *g;
  
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd96,"void ImGui::NewFrame()");
  }
  pIStack_10 = GImGui;
  if ((GImGui->Initialized & 1U) == 0) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9b,"void ImGui::NewFrame()");
  }
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f && \"Need a positive DeltaTime (zero is tolerated but will cause some timing issues)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9c,"void ImGui::NewFrame()");
  }
  bVar2 = false;
  if ((0.0 <= (GImGui->IO).DisplaySize.x) && (bVar2 = false, 0.0 <= (GImGui->IO).DisplaySize.y)) {
    bVar2 = true;
  }
  if (!bVar2) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9d,"void ImGui::NewFrame()");
  }
  if ((((GImGui->IO).Fonts)->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9e,"void ImGui::NewFrame()");
  }
  ppIVar5 = ImVector<ImFont_*>::operator[](&((GImGui->IO).Fonts)->Fonts,0);
  bVar2 = ImFont::IsLoaded(*ppIVar5);
  if (!bVar2) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9f,"void ImGui::NewFrame()");
  }
  if ((pIStack_10->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda0,"void ImGui::NewFrame()");
  }
  bVar2 = false;
  if ((0.0 <= (pIStack_10->Style).Alpha) && (bVar2 = false, (pIStack_10->Style).Alpha <= 1.0)) {
    bVar2 = true;
  }
  if (bVar2) {
    if ((pIStack_10->FrameCount == 0) ||
       (bVar2 = false, pIStack_10->FrameCountEnded == pIStack_10->FrameCount)) {
      bVar2 = true;
    }
    if (!bVar2) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xda2,"void ImGui::NewFrame()");
    }
    for (local_14 = 0; local_14 < 0x15; local_14 = local_14 + 1) {
      bVar2 = false;
      if ((-2 < (pIStack_10->IO).KeyMap[local_14]) &&
         (bVar2 = false, (pIStack_10->IO).KeyMap[local_14] < 0x200)) {
        bVar2 = true;
      }
      if (!bVar2) {
        __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0xda4,"void ImGui::NewFrame()");
      }
    }
    if ((((pIStack_10->IO).ConfigFlags & 1U) != 0) && ((pIStack_10->IO).KeyMap[0xc] == -1)) {
      __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xda8,"void ImGui::NewFrame()");
    }
    if ((pIStack_10->SettingsLoaded & 1U) == 0) {
      bVar2 = ImVector<ImGuiWindowSettings>::empty(&pIStack_10->SettingsWindows);
      if (!bVar2) {
        __assert_fail("g.SettingsWindows.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0xdad,"void ImGui::NewFrame()");
      }
      if ((pIStack_10->IO).IniFilename != (char *)0x0) {
        LoadIniSettingsFromDisk((pIStack_10->IO).IniFilename);
      }
      pIStack_10->SettingsLoaded = true;
    }
    if ((0.0 < pIStack_10->SettingsDirtyTimer) &&
       (pIStack_10->SettingsDirtyTimer = pIStack_10->SettingsDirtyTimer - (pIStack_10->IO).DeltaTime
       , pIStack_10->SettingsDirtyTimer <= 0.0)) {
      if ((pIStack_10->IO).IniFilename == (char *)0x0) {
        (pIStack_10->IO).WantSaveIniSettings = true;
      }
      else {
        SaveIniSettingsToDisk((pIStack_10->IO).IniFilename);
      }
      pIStack_10->SettingsDirtyTimer = 0.0;
    }
    pIStack_10->Time = (pIStack_10->IO).DeltaTime + pIStack_10->Time;
    pIStack_10->FrameCount = pIStack_10->FrameCount + 1;
    pIStack_10->TooltipOverrideCount = 0;
    pIStack_10->WindowsActiveCount = 0;
    font = GetDefaultFont();
    SetCurrentFont(font);
    bVar2 = ImFont::IsLoaded(pIStack_10->Font);
    if (bVar2) {
      ImVec4::ImVec4((ImVec4 *)&stack0xffffffffffffffdc,0.0,0.0,(pIStack_10->IO).DisplaySize.x,
                     (pIStack_10->IO).DisplaySize.y);
      (pIStack_10->DrawListSharedData).ClipRectFullscreen.x = fStack_24;
      (pIStack_10->DrawListSharedData).ClipRectFullscreen.y = (float)i;
      (pIStack_10->DrawListSharedData).ClipRectFullscreen.z = local_1c;
      (pIStack_10->DrawListSharedData).ClipRectFullscreen.w = fStack_18;
      (pIStack_10->DrawListSharedData).CurveTessellationTol =
           (pIStack_10->Style).CurveTessellationTol;
      ImDrawList::Clear(&pIStack_10->OverlayDrawList);
      ImDrawList::PushTextureID(&pIStack_10->OverlayDrawList,((pIStack_10->IO).Fonts)->TexID);
      ImDrawList::PushClipRectFullScreen(&pIStack_10->OverlayDrawList);
      uVar3 = 0;
      if (((pIStack_10->Style).AntiAliasedFill & 1U) != 0) {
        uVar3 = 2;
      }
      (pIStack_10->OverlayDrawList).Flags = ((pIStack_10->Style).AntiAliasedLines & 1U) != 0 | uVar3
      ;
      ImDrawData::Clear(&pIStack_10->DrawData);
      if (pIStack_10->HoveredIdPreviousFrame == 0) {
        pIStack_10->HoveredIdTimer = 0.0;
      }
      pIStack_10->HoveredIdPreviousFrame = pIStack_10->HoveredId;
      pIStack_10->HoveredId = 0;
      pIStack_10->HoveredIdAllowOverlap = false;
      if ((((pIStack_10->ActiveIdIsAlive & 1U) == 0) &&
          (pIStack_10->ActiveIdPreviousFrame == pIStack_10->ActiveId)) &&
         (pIStack_10->ActiveId != 0)) {
        ClearActiveID();
      }
      if (pIStack_10->ActiveId != 0) {
        pIStack_10->ActiveIdTimer = (pIStack_10->IO).DeltaTime + pIStack_10->ActiveIdTimer;
      }
      pIStack_10->ActiveIdPreviousFrame = pIStack_10->ActiveId;
      pIStack_10->ActiveIdIsAlive = false;
      pIStack_10->ActiveIdIsJustActivated = false;
      if ((pIStack_10->ScalarAsInputTextId != 0) &&
         (pIStack_10->ActiveId != pIStack_10->ScalarAsInputTextId)) {
        pIStack_10->ScalarAsInputTextId = 0;
      }
      if (((pIStack_10->DragDropActive & 1U) != 0) &&
         ((pIStack_10->DragDropPayload).DataFrameCount + 1 < pIStack_10->FrameCount)) {
        ClearDragDrop();
        ImVector<unsigned_char>::clear(&pIStack_10->DragDropPayloadBufHeap);
        memset(pIStack_10->DragDropPayloadBufLocal,0,8);
      }
      pIStack_10->DragDropAcceptIdPrev = pIStack_10->DragDropAcceptIdCurr;
      pIStack_10->DragDropAcceptIdCurr = 0;
      pIStack_10->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
      memcpy((pIStack_10->IO).KeysDownDurationPrev,(pIStack_10->IO).KeysDownDuration,0x800);
      for (local_28 = 0; local_28 < 0x200; local_28 = local_28 + 1) {
        if (((pIStack_10->IO).KeysDown[local_28] & 1U) == 0) {
          local_9c = -1.0;
        }
        else {
          pfVar1 = (pIStack_10->IO).KeysDownDuration + local_28;
          if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
            local_98 = (pIStack_10->IO).KeysDownDuration[local_28] + (pIStack_10->IO).DeltaTime;
          }
          else {
            local_98 = 0.0;
          }
          local_9c = local_98;
        }
        (pIStack_10->IO).KeysDownDuration[local_28] = local_9c;
      }
      NavUpdate();
      UpdateMouseInputs();
      pIStack_10->FramerateSecPerFrameAccum =
           ((pIStack_10->IO).DeltaTime -
           pIStack_10->FramerateSecPerFrame[pIStack_10->FramerateSecPerFrameIdx]) +
           pIStack_10->FramerateSecPerFrameAccum;
      pIStack_10->FramerateSecPerFrame[pIStack_10->FramerateSecPerFrameIdx] =
           (pIStack_10->IO).DeltaTime;
      pIStack_10->FramerateSecPerFrameIdx = (pIStack_10->FramerateSecPerFrameIdx + 1) % 0x78;
      if (pIStack_10->FramerateSecPerFrameAccum <= 0.0) {
        local_a0 = 3.4028235e+38;
      }
      else {
        local_a0 = 1.0 / (pIStack_10->FramerateSecPerFrameAccum / 120.0);
      }
      (pIStack_10->IO).Framerate = local_a0;
      UpdateMovingWindow();
      NewFrameUpdateHoveredWindowAndCaptureFlags();
      pIVar6 = GetFrontMostPopupModal();
      if (pIVar6 == (ImGuiWindow *)0x0) {
        pIStack_10->ModalWindowDarkeningRatio = 0.0;
      }
      else {
        fVar8 = ImMin<float>((pIStack_10->IO).DeltaTime * 6.0 +
                             pIStack_10->ModalWindowDarkeningRatio,1.0);
        pIStack_10->ModalWindowDarkeningRatio = fVar8;
      }
      pIStack_10->MouseCursor = 0;
      pIStack_10->WantTextInputNextFrame = -1;
      pIStack_10->WantCaptureKeyboardNextFrame = -1;
      pIStack_10->WantCaptureMouseNextFrame = -1;
      ImVec2::ImVec2((ImVec2 *)&window,1.0,1.0);
      pIStack_10->PlatformImePos = (ImVec2)window;
      if (((pIStack_10->HoveredWindow != (ImGuiWindow *)0x0) &&
          ((pIStack_10->HoveredWindow->Collapsed & 1U) == 0)) &&
         ((fVar8 = (pIStack_10->IO).MouseWheel, fVar8 != 0.0 ||
          (((NAN(fVar8) || (fVar8 = (pIStack_10->IO).MouseWheelH, fVar8 != 0.0)) || (NAN(fVar8))))))
         ) {
        pIVar6 = pIStack_10->HoveredWindow;
        _new_font_scale = pIVar6;
        while( true ) {
          bVar2 = false;
          if ((((_new_font_scale->Flags & 0x1000000U) != 0) &&
              (bVar2 = false, (_new_font_scale->Flags & 0x10U) != 0)) &&
             ((bVar2 = false, (_new_font_scale->Flags & 8U) == 0 &&
              (bVar2 = false, (_new_font_scale->Flags & 0x200U) == 0)))) {
            bVar2 = _new_font_scale->ParentWindow != (ImGuiWindow *)0x0;
          }
          if (!bVar2) break;
          _new_font_scale = _new_font_scale->ParentWindow;
        }
        bVar2 = false;
        if ((_new_font_scale->Flags & 0x10U) == 0) {
          bVar2 = (_new_font_scale->Flags & 0x200U) == 0;
        }
        fVar8 = (pIStack_10->IO).MouseWheel;
        if ((fVar8 != 0.0) || (NAN(fVar8))) {
          if ((((pIStack_10->IO).KeyCtrl & 1U) == 0) ||
             (((pIStack_10->IO).FontAllowUserScaling & 1U) == 0)) {
            if ((((pIStack_10->IO).KeyCtrl & 1U) == 0) && (bVar2)) {
              fVar9 = ImGuiWindow::CalcFontSize(_new_font_scale);
              i_1 = (int)(fVar9 * 5.0);
              fVar10 = ImRect::GetHeight(&_new_font_scale->ContentsRegionRect);
              fVar8 = (_new_font_scale->WindowPadding).y;
              fVar8 = ImMin<float>(fVar9 * 5.0,(fVar8 + fVar8 + fVar10) * 0.67);
              i_1 = (int)(float)(int)fVar8;
              SetWindowScrollY(_new_font_scale,
                               -(pIStack_10->IO).MouseWheel * (float)i_1 +
                               (_new_font_scale->Scroll).y);
            }
          }
          else {
            offset.y = ImClamp<float>((pIStack_10->IO).MouseWheel * 0.1 + pIVar6->FontWindowScale,
                                      0.5,2.5);
            offset.x = offset.y / pIVar6->FontWindowScale;
            pIVar6->FontWindowScale = offset.y;
            local_64 = ::operator*(&pIVar6->Size,1.0 - offset.x);
            _scroll_amount_1 = ::operator-(&(pIStack_10->IO).MousePos,&pIVar6->Pos);
            local_5c = ::operator*(&local_64,(ImVec2 *)&scroll_amount_1);
            local_54 = ::operator/(&local_5c,&pIVar6->Size);
            operator+=(&pIVar6->Pos,&local_54);
            operator*=(&pIVar6->Size,offset.x);
            operator*=(&pIVar6->SizeFull,offset.x);
          }
        }
        fVar8 = (pIStack_10->IO).MouseWheelH;
        if ((((fVar8 != 0.0) || (NAN(fVar8))) && (bVar2)) &&
           ((window_1._4_4_ = ImGuiWindow::CalcFontSize(_new_font_scale),
            ((pIStack_10->IO).KeyCtrl & 1U) == 0 && ((pIVar6->Flags & 0x10U) == 0)))) {
          SetWindowScrollX(pIVar6,-(pIStack_10->IO).MouseWheelH * window_1._4_4_ +
                                  (pIVar6->Scroll).x);
        }
      }
      if (((pIStack_10->ActiveId == 0) && (pIStack_10->NavWindow != (ImGuiWindow *)0x0)) &&
         (((pIStack_10->NavWindow->Active & 1U) != 0 &&
          ((((pIStack_10->NavWindow->Flags & 0x40000U) == 0 &&
            (((pIStack_10->IO).KeyCtrl & 1U) == 0)) && (bVar2 = IsKeyPressedMap(0,false), bVar2)))))
         ) {
        if ((pIStack_10->NavId == 0) || (pIStack_10->NavIdTabCounter == 0x7fffffff)) {
          iVar4 = 0;
          if (((pIStack_10->IO).KeyShift & 1U) != 0) {
            iVar4 = -1;
          }
          pIStack_10->NavWindow->FocusIdxTabRequestNext = iVar4;
        }
        else {
          iVar4 = 1;
          if (((pIStack_10->IO).KeyShift & 1U) != 0) {
            iVar4 = -1;
          }
          pIStack_10->NavWindow->FocusIdxTabRequestNext = pIStack_10->NavIdTabCounter + 1 + iVar4;
        }
      }
      pIStack_10->NavIdTabCounter = 0x7fffffff;
      for (window_1._0_4_ = 0; (int)window_1 != (pIStack_10->Windows).Size;
          window_1._0_4_ = (int)window_1 + 1) {
        ppIVar7 = ImVector<ImGuiWindow_*>::operator[](&pIStack_10->Windows,(int)window_1);
        local_80 = *ppIVar7;
        local_80->WasActive = (bool)(local_80->Active & 1);
        local_80->Active = false;
        local_80->WriteAccessed = false;
      }
      if ((pIStack_10->NavWindow != (ImGuiWindow *)0x0) &&
         ((pIStack_10->NavWindow->WasActive & 1U) == 0)) {
        FocusFrontMostActiveWindow((ImGuiWindow *)0x0);
      }
      ImVector<ImGuiWindow_*>::resize(&pIStack_10->CurrentWindowStack,0);
      ImVector<ImGuiPopupRef>::resize(&pIStack_10->CurrentPopupStack,0);
      ClosePopupsOverWindow(pIStack_10->NavWindow);
      ImVec2::ImVec2(&local_88,400.0,400.0);
      SetNextWindowSize(&local_88,4);
      Begin("Debug##Default",(bool *)0x0,0);
      return;
    }
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xdc7,"void ImGui::NewFrame()");
  }
  __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0xda1,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?");
    ImGuiContext& g = *GImGui;

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.IO.DeltaTime >= 0.0f                                    && "Need a positive DeltaTime (zero is tolerated but will cause some timing issues)");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check for required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();
    g.OverlayDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.DrawData.Clear();

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.ScalarAsInputTextId && g.ActiveId != g.ScalarAsInputTextId)
        g.ScalarAsInputTextId = 0;

    // Elapse drag & drop payload
    if (g.DragDropActive && g.DragDropPayload.DataFrameCount + 1 < g.FrameCount)
    {
        ClearDragDrop();
        g.DragDropPayloadBufHeap.clear();
        memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
    }
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMovingWindow();
    NewFrameUpdateHoveredWindowAndCaptureFlags();

    if (GetFrontMostPopupModal() != NULL)
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.ModalWindowDarkeningRatio = 0.0f;

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    if (g.HoveredWindow && !g.HoveredWindow->Collapsed && (g.IO.MouseWheel != 0.0f || g.IO.MouseWheelH != 0.0f))
    {
        // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent (unless either ImGuiWindowFlags_NoInputs or ImGuiWindowFlags_NoScrollbar are also set).
        ImGuiWindow* window = g.HoveredWindow;
        ImGuiWindow* scroll_window = window;
        while ((scroll_window->Flags & ImGuiWindowFlags_ChildWindow) && (scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoScrollbar) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs) && scroll_window->ParentWindow)
            scroll_window = scroll_window->ParentWindow;
        const bool scroll_allowed = !(scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs);

        if (g.IO.MouseWheel != 0.0f)
        {
            if (g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                const float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
            else if (!g.IO.KeyCtrl && scroll_allowed)
            {
                // Mouse wheel vertical scrolling
                float scroll_amount = 5 * scroll_window->CalcFontSize();
                scroll_amount = (float)(int)ImMin(scroll_amount, (scroll_window->ContentsRegionRect.GetHeight() + scroll_window->WindowPadding.y * 2.0f) * 0.67f);
                SetWindowScrollY(scroll_window, scroll_window->Scroll.y - g.IO.MouseWheel * scroll_amount);
            }
        }
        if (g.IO.MouseWheelH != 0.0f && scroll_allowed)
        {
            // Mouse wheel horizontal scrolling (for hardware that supports it)
            float scroll_amount = scroll_window->CalcFontSize();
            if (!g.IO.KeyCtrl && !(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
                SetWindowScrollX(window, window->Scroll.x - g.IO.MouseWheelH * scroll_amount);
        }
    }

    // Pressing TAB activate widget focus
    if (g.ActiveId == 0 && g.NavWindow != NULL && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab, false))
    {
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.NavWindow->FocusIdxTabRequestNext = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.NavWindow->FocusIdxTabRequestNext = g.IO.KeyShift ? -1 : 0;
    }
    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusFrontMostActiveWindow(NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow);

    // Create implicit window - we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
}